

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser * init_parse_names(void)

{
  parser *p;
  undefined4 *v;
  
  p = parser_new();
  v = (undefined4 *)mem_zalloc(0x28);
  *v = 0;
  parser_setpriv(p,v);
  parser_reg(p,"section uint section",parse_names_section);
  parser_reg(p,"word str name",parse_names_word);
  return p;
}

Assistant:

static struct parser *init_parse_names(void) {
	struct parser *p = parser_new();
	struct names_parse *n = mem_zalloc(sizeof *n);
	n->section = 0;
	parser_setpriv(p, n);
	parser_reg(p, "section uint section", parse_names_section);
	parser_reg(p, "word str name", parse_names_word);
	return p;
}